

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void PredictorAdd1_C(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  long in_RCX;
  int in_EDX;
  long in_RDI;
  uint32_t left;
  int i;
  undefined4 local_28;
  undefined4 local_24;
  
  local_28 = *(uint32_t *)(in_RCX + -4);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    local_28 = VP8LAddPixels(*(uint32_t *)(in_RDI + (long)local_24 * 4),local_28);
    *(uint32_t *)(in_RCX + (long)local_24 * 4) = local_28;
  }
  return;
}

Assistant:

static void PredictorAdd1_C(const uint32_t* in, const uint32_t* upper,
                            int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  uint32_t left = out[-1];
  (void)upper;
  for (i = 0; i < num_pixels; ++i) {
    out[i] = left = VP8LAddPixels(in[i], left);
  }
}